

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlFreeIDCHashEntry(void *payload,xmlChar *name)

{
  undefined8 *puVar1;
  
  while ((undefined8 *)payload != (undefined8 *)0x0) {
    puVar1 = *payload;
    (*xmlFree)(payload);
    payload = puVar1;
  }
  return;
}

Assistant:

static void
xmlFreeIDCHashEntry (void *payload, const xmlChar *name ATTRIBUTE_UNUSED)
{
    xmlIDCHashEntryPtr e = payload, n;
    while (e) {
	n = e->next;
	xmlFree(e);
	e = n;
    }
}